

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O0

void __thiscall rengine::GlyphTextureJob::onExecute(GlyphTextureJob *this)

{
  uint uVar1;
  stbtt_fontinfo *psVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  reference pvVar6;
  int *piVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  ostream *poVar11;
  float shift_x;
  double dVar12;
  rep_conflict rVar13;
  duration<long,_std::ratio<1L,_1000000000L>_> local_148;
  duration<double,_std::ratio<1L,_1L>_> local_140;
  duration<double,_std::ratio<1L,_1L>_> diff;
  time_point end;
  int bmh;
  int bmw;
  float xShift_1;
  int y1_1;
  int x1_1;
  int y0_1;
  int x0_1;
  int glyph;
  uint i_1;
  float y;
  float x;
  int cb;
  int cg;
  int cr;
  int ca;
  uint *local_e0;
  uint *textureData;
  uchar *bmData;
  int local_c8;
  int local_c4;
  int local_c0;
  int y1;
  int y0;
  int x1;
  int x0;
  float xShift;
  int leftSideBearing;
  int advance;
  int g;
  int local_98;
  int local_94;
  int i;
  int maxBmHeight;
  int maxBmWidth;
  float xpos;
  vector<float,_std::allocator<float>_> advances;
  vector<int,_std::allocator<int>_> glyphs;
  int lineGap;
  int descent;
  int ascent;
  float scale;
  stbtt_fontinfo *fontInfo;
  time_point start;
  GlyphTextureJob *this_local;
  
  start.__d.__r = (duration)(duration)this;
  fontInfo = (stbtt_fontinfo *)std::chrono::_V2::system_clock::now();
  _ascent = GlyphContext::fontInfo(this->m_context);
  descent = (int)stbtt_ScaleForPixelHeight(_ascent,(float)this->m_pixelSize);
  stbtt_GetFontVMetrics
            (_ascent,&lineGap,
             (int *)((long)&glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&maxBmWidth);
  maxBmHeight = 0;
  i = 0;
  local_94 = 0;
  local_98 = 0;
  while( true ) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_text);
    psVar2 = _ascent;
    if (*pcVar5 == '\0') break;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_text);
    leftSideBearing = stbtt_FindGlyphIndex(psVar2,(int)*pcVar5);
    psVar2 = _ascent;
    iVar4 = descent;
    if (1 < local_98) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          &advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      iVar3 = stbtt_GetCodepointKernAdvance(psVar2,*pvVar6,leftSideBearing);
      maxBmHeight = (int)((float)iVar4 * (float)iVar3 + (float)maxBmHeight);
    }
    stbtt_GetGlyphHMetrics(_ascent,leftSideBearing,(int *)&xShift,&x0);
    iVar4 = maxBmHeight;
    dVar12 = std::floor((double)(ulong)(uint)maxBmHeight);
    x1 = (int)((float)iVar4 - SUB84(dVar12,0));
    stbtt_GetGlyphBitmapBoxSubpixel
              (_ascent,leftSideBearing,(float)descent,(float)descent,(float)x1,0.0,&y0,&local_c0,&y1
               ,&local_c4);
    local_c8 = y1 - y0;
    piVar7 = std::max<int>(&local_c8,&i);
    i = *piVar7;
    bmData._4_4_ = local_c4 - local_c0;
    piVar7 = std::max<int>((int *)((long)&bmData + 4),&local_94);
    local_94 = *piVar7;
    maxBmHeight = (int)((float)descent * (float)((int)xShift - x0) + (float)maxBmHeight);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&maxBmWidth,
               (value_type_conflict2 *)&maxBmHeight);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&leftSideBearing);
    local_98 = local_98 + 1;
  }
  dVar12 = std::ceil((double)(ulong)(uint)maxBmHeight);
  this->m_textureWidth = (int)SUB84(dVar12,0);
  dVar12 = std::ceil((double)(ulong)(uint)((float)(lineGap -
                                                  glyphs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_) * (float)descent));
  this->m_textureHeight = (int)SUB84(dVar12,0);
  textureData = (uint *)malloc((long)(i * local_94));
  local_e0 = (uint *)calloc((long)(this->m_textureWidth * this->m_textureHeight),4);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,void(*)(void*),void>
            ((shared_ptr<unsigned_int> *)&cr,local_e0,free);
  std::shared_ptr<unsigned_int>::operator=(&this->m_textureData,(shared_ptr<unsigned_int> *)&cr);
  std::shared_ptr<unsigned_int>::~shared_ptr((shared_ptr<unsigned_int> *)&cr);
  cg = (int)((this->m_color).w * 255.0);
  cb = (int)((this->m_color).w * (this->m_color).x * 255.0);
  x = (float)(int)((this->m_color).w * (this->m_color).y * 255.0);
  y = (float)(int)((this->m_color).w * (this->m_color).z * 255.0);
  i_1 = 0;
  glyph = (int)((float)lineGap * (float)descent);
  x0_1 = 0;
  while( true ) {
    uVar8 = (ulong)(uint)x0_1;
    sVar9 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar9 <= uVar8) {
      free(textureData);
      diff.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
      local_148.__r =
           (rep)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&diff,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)&fontInfo);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_140,&local_148);
      poVar11 = std::operator<<((ostream *)&std::cout,"generated glyph texture for \'");
      poVar11 = std::operator<<(poVar11,(string *)&this->m_text);
      poVar11 = std::operator<<(poVar11,"\' in ");
      rVar13 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_140);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,rVar13 * 1000.0);
      poVar11 = std::operator<<(poVar11," ms");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&maxBmWidth);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)(uint)x0_1);
    uVar1 = i_1;
    y0_1 = *pvVar6;
    dVar12 = std::floor((double)(ulong)i_1);
    shift_x = (float)uVar1 - SUB84(dVar12,0);
    stbtt_GetGlyphBitmapBoxSubpixel
              (_ascent,y0_1,(float)descent,(float)descent,shift_x,0.0,&x1_1,&y1_1,(int *)&xShift_1,
               &bmw);
    if (i < (int)xShift_1 - x1_1) break;
    if (local_94 < bmw - y1_1) {
      __assert_fail("y1 - y0 <= maxBmHeight",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                    ,0xc3,"virtual void rengine::GlyphTextureJob::onExecute()");
    }
    iVar4 = (int)xShift_1 - x1_1;
    iVar3 = bmw - y1_1;
    stbtt_MakeGlyphBitmapSubpixel
              (_ascent,(uchar *)textureData,iVar4,iVar3,iVar4,(float)descent,(float)descent,shift_x,
               0.0,y0_1);
    renderSingleGlyph(this,(int)(float)i_1,(int)((float)glyph + (float)y1_1),local_e0,
                      this->m_textureWidth,this->m_textureHeight,(uchar *)textureData,iVar4,iVar3,cb
                      ,(int)x,(int)y,cg);
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&maxBmWidth,(ulong)(uint)x0_1);
    i_1 = (uint)*pvVar10;
    x0_1 = x0_1 + 1;
  }
  __assert_fail("x1 - x0 <= maxBmWidth",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                ,0xc2,"virtual void rengine::GlyphTextureJob::onExecute()");
}

Assistant:

inline void GlyphTextureJob::onExecute()
{
    auto start = std::chrono::system_clock::now();

    const stbtt_fontinfo *fontInfo = m_context->fontInfo();
    float scale = stbtt_ScaleForPixelHeight(fontInfo, m_pixelSize);

    int ascent, descent, lineGap;
    stbtt_GetFontVMetrics(fontInfo, &ascent, &descent, &lineGap);

    // std::cout << "GlyphTextureJob::onExecute: text='" << m_text
    //           << "', size=" << m_pixelSize
    //           << ", scale=" << scale
    //           << ", ascent=" << ascent
    //           << ", descent=" << descent
    //           << ", lineGap=" << lineGap
    //           << std::endl;

    std::vector<int> glyphs;
    std::vector<float> advances;

    float xpos = 0;

    int maxBmWidth = 0;
    int maxBmHeight = 0;

    for (int i=0; m_text[i]; ++i) {
        int g = stbtt_FindGlyphIndex(fontInfo, m_text[i]);
        if (i > 1) {
            xpos += scale*stbtt_GetCodepointKernAdvance(fontInfo, glyphs.back(), g);
        }
        int advance, leftSideBearing;
        stbtt_GetGlyphHMetrics(fontInfo, g, &advance, &leftSideBearing);

        float xShift = xpos - (float) std::floor(xpos);
        int x0, x1, y0, y1;
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, g, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);
        maxBmWidth = std::max(x1 - x0, maxBmWidth);
        maxBmHeight = std::max(y1 - y0, maxBmHeight);

        // std::cout << " - '" << m_text[i] << "': index=" << g << ", advance=" << advance << "/" << xpos << ", lsb=" << leftSideBearing
        //           << ", box=" << x0 << "-" << x1 << ", " << y0 << "-" << y1 << std::endl;

        xpos += scale * (advance - leftSideBearing);

        advances.push_back(xpos);
        glyphs.push_back(g);
    }

    m_textureWidth = std::ceil(xpos);
    m_textureHeight = std::ceil((ascent - descent) * scale);

    // std::cout << " - dimensions texture=" << m_textureWidth << "x" << m_textureHeight
    //           << ", bitmap=" << maxBmWidth << "x" << maxBmHeight << std::endl;

    unsigned char *bmData = (unsigned char *) malloc(maxBmWidth * maxBmHeight);
    unsigned int *textureData = (unsigned int *) calloc(m_textureWidth * m_textureHeight, 4);
    m_textureData = std::shared_ptr<unsigned int>(textureData, free);

    int ca = m_color.w * 255;
    int cr = m_color.w * m_color.x * 255;
    int cg = m_color.w * m_color.y * 255;
    int cb = m_color.w * m_color.z * 255;

    float x = 0;
    float y = ascent * scale;
    for (unsigned i=0; i<glyphs.size(); ++i) {
        int glyph = glyphs[i];

        int x0, y0, x1, y1;

        float xShift = x - (float) std::floor(x);
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, glyph, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);

        assert(x1 - x0 <= maxBmWidth);
        assert(y1 - y0 <= maxBmHeight);

        int bmw = x1 - x0;
        int bmh = y1 - y0;
        stbtt_MakeGlyphBitmapSubpixel(fontInfo, bmData, bmw, bmh, bmw, scale, scale, xShift, 0, glyph);

        renderSingleGlyph(x, y + y0,
                          textureData, m_textureWidth, m_textureHeight,
                          bmData, bmw, bmh,
                          cr, cg, cb, ca);

        x = advances[i];
    }

    free(bmData);

    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end - start;
    std::cout << "generated glyph texture for '" << m_text << "' in " << diff.count() * 1000 << " ms" << std::endl;
}